

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O1

void __thiscall
MissingDependencyScanner::ProcessNodeDeps
          (MissingDependencyScanner *this,Node *node,Node **dep_nodes,int dep_nodes_count)

{
  _Rb_tree_header *p_Var1;
  Edge *to;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  ulong uVar6;
  iterator ne;
  Edge **ppEVar7;
  Node **__v;
  vector<Edge_*,_std::allocator<Edge_*>_> missing_deps;
  Edge *deplog_edge;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> deplog_edges;
  Edge **local_c8;
  iterator iStack_c0;
  Edge **local_b8;
  Node **local_b0;
  Node *local_a8;
  ulong local_a0;
  Rule *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_60;
  
  to = node->in_edge_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b0 = dep_nodes;
  local_a8 = node;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < dep_nodes_count) {
    uVar6 = 0;
    do {
      pNVar2 = local_b0[uVar6];
      iVar4 = std::__cxx11::string::compare((char *)pNVar2);
      if (iVar4 == 0) goto LAB_0011c9d2;
      local_90._M_impl._0_8_ = pNVar2->in_edge_;
      if ((Edge *)local_90._M_impl._0_8_ != (Edge *)0x0) {
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
        _M_insert_unique<Edge*const&>
                  ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                    *)&local_60,(Edge **)&local_90);
      }
      uVar6 = uVar6 + 1;
    } while ((uint)dep_nodes_count != uVar6);
  }
  local_c8 = (Edge **)0x0;
  iStack_c0._M_current = (Edge **)0x0;
  local_b8 = (Edge **)0x0;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      bVar3 = PathExistsBetween(this,*(Edge **)(p_Var5 + 1),to);
      if (!bVar3) {
        if (iStack_c0._M_current == local_b8) {
          std::vector<Edge*,std::allocator<Edge*>>::_M_realloc_insert<Edge*const&>
                    ((vector<Edge*,std::allocator<Edge*>> *)&local_c8,iStack_c0,
                     (Edge **)(p_Var5 + 1));
        }
        else {
          *iStack_c0._M_current = *(Edge **)(p_Var5 + 1);
          iStack_c0._M_current = iStack_c0._M_current + 1;
        }
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var1);
  }
  if (local_c8 != iStack_c0._M_current) {
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_c8 != iStack_c0._M_current) {
      local_a0 = (ulong)(uint)dep_nodes_count;
      ppEVar7 = local_c8;
      do {
        uVar6 = local_a0;
        __v = local_b0;
        if (0 < dep_nodes_count) {
          do {
            if ((*__v)->in_edge_ == *ppEVar7) {
              std::
              _Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
              _M_insert_unique<Node*const&>
                        ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                          *)&this->generated_nodes_,__v);
              local_98 = (*ppEVar7)->rule_;
              std::
              _Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
              ::_M_insert_unique<Rule_const*>
                        ((_Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
                          *)&this->generator_rules_,&local_98);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_90,&(*ppEVar7)->rule_->name_);
              (*this->delegate_->_vptr_MissingDependencyScannerDelegate[2])
                        (this->delegate_,local_a8,*__v,(*ppEVar7)->rule_);
            }
            __v = __v + 1;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        ppEVar7 = ppEVar7 + 1;
      } while (ppEVar7 != iStack_c0._M_current);
    }
    this->missing_dep_path_count_ =
         this->missing_dep_path_count_ + (int)local_90._M_impl.super__Rb_tree_header._M_node_count;
    std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
    _M_insert_unique<Node*const&>
              ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *
               )&this->nodes_missing_deps_,&local_a8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_90);
  }
  if (local_c8 != (Edge **)0x0) {
    operator_delete(local_c8,(long)local_b8 - (long)local_c8);
  }
LAB_0011c9d2:
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MissingDependencyScanner::ProcessNodeDeps(Node* node, Node** dep_nodes,
                                               int dep_nodes_count) {
  Edge* edge = node->in_edge();
  std::set<Edge*> deplog_edges;
  for (int i = 0; i < dep_nodes_count; ++i) {
    Node* deplog_node = dep_nodes[i];
    // Special exception: A dep on build.ninja can be used to mean "always
    // rebuild this target when the build is reconfigured", but build.ninja is
    // often generated by a configuration tool like cmake or gn. The rest of
    // the build "implicitly" depends on the entire build being reconfigured,
    // so a missing dep path to build.ninja is not an actual missing dependency
    // problem.
    if (deplog_node->path() == "build.ninja")
      return;
    Edge* deplog_edge = deplog_node->in_edge();
    if (deplog_edge) {
      deplog_edges.insert(deplog_edge);
    }
  }
  std::vector<Edge*> missing_deps;
  for (std::set<Edge*>::iterator de = deplog_edges.begin();
       de != deplog_edges.end(); ++de) {
    if (!PathExistsBetween(*de, edge)) {
      missing_deps.push_back(*de);
    }
  }

  if (!missing_deps.empty()) {
    std::set<std::string> missing_deps_rule_names;
    for (std::vector<Edge*>::iterator ne = missing_deps.begin();
         ne != missing_deps.end(); ++ne) {
      for (int i = 0; i < dep_nodes_count; ++i) {
        if (dep_nodes[i]->in_edge() == *ne) {
          generated_nodes_.insert(dep_nodes[i]);
          generator_rules_.insert(&(*ne)->rule());
          missing_deps_rule_names.insert((*ne)->rule().name());
          delegate_->OnMissingDep(node, dep_nodes[i]->path(), (*ne)->rule());
        }
      }
    }
    missing_dep_path_count_ += missing_deps_rule_names.size();
    nodes_missing_deps_.insert(node);
  }
}